

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginDisabled(bool disabled)

{
  float fVar1;
  int *__src;
  ImGuiContext *pIVar2;
  uint uVar3;
  int iVar4;
  int *__dest;
  int iVar5;
  int iVar6;
  
  pIVar2 = GImGui;
  uVar3 = GImGui->CurrentItemFlags;
  if ((uVar3 >> 10 & 1) == 0 && disabled) {
    fVar1 = (GImGui->Style).Alpha;
    GImGui->DisabledAlphaBackup = fVar1;
    (pIVar2->Style).Alpha = fVar1 * (pIVar2->Style).DisabledAlpha;
  }
  if ((uVar3 >> 10 & 1) != 0 || disabled) {
    uVar3 = uVar3 | 0x400;
    pIVar2->CurrentItemFlags = uVar3;
  }
  iVar5 = (pIVar2->ItemFlagsStack).Size;
  if (iVar5 == (pIVar2->ItemFlagsStack).Capacity) {
    if (iVar5 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar5 / 2 + iVar5;
    }
    iVar6 = iVar5 + 1;
    if (iVar5 + 1 < iVar4) {
      iVar6 = iVar4;
    }
    __dest = (int *)MemAlloc((long)iVar6 << 2);
    __src = (pIVar2->ItemFlagsStack).Data;
    if (__src != (int *)0x0) {
      memcpy(__dest,__src,(long)(pIVar2->ItemFlagsStack).Size << 2);
      MemFree((pIVar2->ItemFlagsStack).Data);
    }
    (pIVar2->ItemFlagsStack).Data = __dest;
    (pIVar2->ItemFlagsStack).Capacity = iVar6;
    uVar3 = pIVar2->CurrentItemFlags;
    iVar5 = (pIVar2->ItemFlagsStack).Size;
  }
  else {
    __dest = (pIVar2->ItemFlagsStack).Data;
  }
  __dest[iVar5] = uVar3;
  (pIVar2->ItemFlagsStack).Size = (pIVar2->ItemFlagsStack).Size + 1;
  pIVar2->DisabledStackSize = pIVar2->DisabledStackSize + 1;
  return;
}

Assistant:

void ImGui::BeginDisabled(bool disabled)
{
    ImGuiContext& g = *GImGui;
    bool was_disabled = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    if (!was_disabled && disabled)
    {
        g.DisabledAlphaBackup = g.Style.Alpha;
        g.Style.Alpha *= g.Style.DisabledAlpha; // PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * g.Style.DisabledAlpha);
    }
    if (was_disabled || disabled)
        g.CurrentItemFlags |= ImGuiItemFlags_Disabled;
    g.ItemFlagsStack.push_back(g.CurrentItemFlags); // FIXME-OPT: can we simply skip this and use DisabledStackSize?
    g.DisabledStackSize++;
}